

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void cmAddLinkLibraryForTarget(void *arg,char *tgt,char *value,int libtype)

{
  char *pcVar1;
  allocator local_129;
  string local_128;
  allocator local_101;
  string local_100;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88;
  allocator local_51;
  string local_50;
  void *local_30;
  cmMakefile *mf;
  char *pcStack_20;
  int libtype_local;
  char *value_local;
  char *tgt_local;
  void *arg_local;
  
  local_30 = arg;
  mf._4_4_ = libtype;
  pcStack_20 = value;
  value_local = tgt;
  tgt_local = (char *)arg;
  if (libtype == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,tgt,&local_51);
    pcVar1 = pcStack_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_88,pcVar1,&local_89);
    cmMakefile::AddLinkLibraryForTarget((cmMakefile *)arg,&local_50,&local_88,GENERAL);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  else if (libtype == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b0,tgt,&local_b1);
    pcVar1 = pcStack_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,pcVar1,&local_d9);
    cmMakefile::AddLinkLibraryForTarget((cmMakefile *)arg,&local_b0,&local_d8,DEBUG);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  else if (libtype == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,tgt,&local_101);
    pcVar1 = pcStack_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_128,pcVar1,&local_129);
    cmMakefile::AddLinkLibraryForTarget((cmMakefile *)arg,&local_100,&local_128,OPTIMIZED);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
  }
  return;
}

Assistant:

void CCONV cmAddLinkLibraryForTarget(void *arg, const char *tgt,
  const char*value, int libtype)
{
  cmMakefile *mf = static_cast<cmMakefile *>(arg);

  switch (libtype)
    {
    case CM_LIBRARY_GENERAL:
      mf->AddLinkLibraryForTarget(tgt,value, cmTarget::GENERAL);
      break;
    case CM_LIBRARY_DEBUG:
      mf->AddLinkLibraryForTarget(tgt,value, cmTarget::DEBUG);
      break;
    case CM_LIBRARY_OPTIMIZED:
      mf->AddLinkLibraryForTarget(tgt,value, cmTarget::OPTIMIZED);
      break;
    }
}